

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendstate.c
# Opt level: O3

void quicly_sendstate_reset(quicly_sendstate_t *state)

{
  quicly_range_t *pqVar1;
  quicly_range_t *__ptr;
  int iVar2;
  uint64_t uVar3;
  
  uVar3 = state->final_size;
  if (uVar3 == 0xffffffffffffffff) {
    uVar3 = state->size_inflight;
    state->final_size = uVar3;
  }
  iVar2 = quicly_ranges_add(&state->acked,0,uVar3 + 1);
  if (iVar2 == 0) {
    __ptr = (state->pending).ranges;
    pqVar1 = &(state->pending)._initial;
    if (__ptr != pqVar1) {
      free(__ptr);
      (state->pending).ranges = pqVar1;
    }
    (state->pending).num_ranges = 0;
    (state->pending).capacity = 1;
    return;
  }
  __assert_fail("ret == 0 && \"guaranteed to succeed, because the numebr of ranges never increases\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/sendstate.c"
                ,0x5d,"void quicly_sendstate_reset(quicly_sendstate_t *)");
}

Assistant:

void quicly_sendstate_reset(quicly_sendstate_t *state)
{
    int ret;

    if (state->final_size == UINT64_MAX)
        state->final_size = state->size_inflight;

    ret = quicly_ranges_add(&state->acked, 0, state->final_size + 1);
    assert(ret == 0 && "guaranteed to succeed, because the numebr of ranges never increases");
    quicly_ranges_clear(&state->pending);
}